

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdjs_json_mapping_api.cpp
# Opt level: O3

string * cfd::js::api::json::JsonMappingApi::AddMultisigSign
                   (string *__return_storage_ptr__,string *request_message)

{
  function<cfd::js::api::RawTransactionResponseStruct_(const_cfd::js::api::AddMultisigSignRequestStruct_&)>
  local_48;
  undefined1 local_28 [16];
  undefined1 local_18 [16];
  
  local_28._8_8_ = 0;
  local_28._0_8_ = TransactionStructApi::AddMultisigSign;
  local_18._8_8_ =
       std::
       _Function_handler<cfd::js::api::RawTransactionResponseStruct_(const_cfd::js::api::AddMultisigSignRequestStruct_&),_cfd::js::api::RawTransactionResponseStruct_(*)(const_cfd::js::api::AddMultisigSignRequestStruct_&)>
       ::_M_invoke;
  local_18._0_8_ =
       std::
       _Function_handler<cfd::js::api::RawTransactionResponseStruct_(const_cfd::js::api::AddMultisigSignRequestStruct_&),_cfd::js::api::RawTransactionResponseStruct_(*)(const_cfd::js::api::AddMultisigSignRequestStruct_&)>
       ::_M_manager;
  local_48.super__Function_base._M_functor._8_8_ = 0;
  local_48.super__Function_base._M_functor._M_unused._M_function_pointer =
       ElementsTransactionStructApi::AddMultisigSign;
  local_48._M_invoker =
       std::
       _Function_handler<cfd::js::api::RawTransactionResponseStruct_(const_cfd::js::api::AddMultisigSignRequestStruct_&),_cfd::js::api::RawTransactionResponseStruct_(*)(const_cfd::js::api::AddMultisigSignRequestStruct_&)>
       ::_M_invoke;
  local_48.super__Function_base._M_manager =
       std::
       _Function_handler<cfd::js::api::RawTransactionResponseStruct_(const_cfd::js::api::AddMultisigSignRequestStruct_&),_cfd::js::api::RawTransactionResponseStruct_(*)(const_cfd::js::api::AddMultisigSignRequestStruct_&)>
       ::_M_manager;
  ExecuteElementsCheckApi<cfd::js::api::json::AddMultisigSignRequest,cfd::js::api::json::RawTransactionResponse,cfd::js::api::AddMultisigSignRequestStruct,cfd::js::api::RawTransactionResponseStruct>
            (__return_storage_ptr__,(json *)request_message,(string *)local_28,&local_48,
             (function<cfd::js::api::RawTransactionResponseStruct_(const_cfd::js::api::AddMultisigSignRequestStruct_&)>
              *)std::
                _Function_handler<cfd::js::api::RawTransactionResponseStruct_(const_cfd::js::api::AddMultisigSignRequestStruct_&),_cfd::js::api::RawTransactionResponseStruct_(*)(const_cfd::js::api::AddMultisigSignRequestStruct_&)>
                ::_M_manager);
  if (local_48.super__Function_base._M_manager != (_Manager_type)0x0) {
    (*local_48.super__Function_base._M_manager)
              ((_Any_data *)&local_48,(_Any_data *)&local_48,__destroy_functor);
  }
  if ((code *)local_18._0_8_ != (code *)0x0) {
    (*(code *)local_18._0_8_)(local_28,local_28,3);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string JsonMappingApi::AddMultisigSign(
    const std::string &request_message) {
  return ExecuteElementsCheckApi<
      api::json::AddMultisigSignRequest, api::json::RawTransactionResponse,
      api::AddMultisigSignRequestStruct, api::RawTransactionResponseStruct>(
      request_message, TransactionStructApi::AddMultisigSign,
#ifndef CFD_DISABLE_ELEMENTS
      ElementsTransactionStructApi::AddMultisigSign);
#else
      TransactionStructApi::AddMultisigSign);
#endif
}